

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O2

void printOperand(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  byte bVar4;
  uint uVar5;
  MCOperand *op;
  ulong uVar6;
  uint8_t uVar7;
  ulong uVar8;
  char *fmt;
  
  op = MCInst_getOperand(MI,OpNo);
  _Var3 = MCOperand_isReg(op);
  if (_Var3) {
    uVar5 = MCOperand_getReg(op);
    printRegName(O,uVar5);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      uVar6 = (ulong)(pcVar2->field_6).x86.op_count;
      if (MI->csh->doing_mem == true) {
        *(uint *)(pcVar2->groups + uVar6 * 0x30 + 0x4a) = uVar5;
      }
      else {
        puVar1 = pcVar2->groups + uVar6 * 0x30 + 0x3e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.op_count * 0x30 + 0x46) = uVar5;
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)(pcVar2->field_6).x86.op_count * 0x30 + 0x5e] =
             MI->csh->regsize_map[uVar5];
        puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
    }
    if (MI->op1_size != '\0') {
      return;
    }
    MI->op1_size = MI->csh->regsize_map[uVar5];
    return;
  }
  _Var3 = MCOperand_isImm(op);
  if (!_Var3) {
    return;
  }
  uVar6 = MCOperand_getImm(op);
  uVar5 = MCInst_getOpcode(MI);
  if (((((((uVar5 - 0x3b < 0x34) && ((0xd80000000000bU >> ((ulong)(uVar5 - 0x3b) & 0x3f) & 1) != 0))
         || ((uVar5 - 0x9ae < 0x40 &&
             ((0xb000000012000009U >> ((ulong)(uVar5 - 0x9ae) & 0x3f) & 1) != 0)))) ||
        ((uVar5 - 0xb54 < 6 ||
         ((uVar5 - 0x212 < 0x11 && ((0x16201U >> (uVar5 - 0x212 & 0x1f) & 1) != 0)))))) ||
       (((uVar5 - 0x4df < 0x36 && ((0x20040040000801U >> ((ulong)(uVar5 - 0x4df) & 0x3f) & 1) != 0))
        || ((uVar5 - 0x75a < 0x11 && ((0x1001bU >> (uVar5 - 0x75a & 0x1f) & 1) != 0)))))) ||
      ((uVar5 - 0xc6 < 5 && (uVar5 - 0xc6 != 2)))) ||
     ((((uVar5 - 0x905 < 0x24 && ((0x900000009U >> ((ulong)(uVar5 - 0x905) & 0x3f) & 1) != 0)) ||
       ((uVar5 - 0x966 < 0x1c && ((0x9000009U >> (uVar5 - 0x966 & 0x1f) & 1) != 0)))) ||
      ((((uVar5 - 0xa49 < 0x2c && ((0x90000000009U >> ((ulong)(uVar5 - 0xa49) & 0x3f) & 1) != 0)) ||
        ((uVar5 - 0xaed < 5 && (uVar5 - 0xaed != 2)))) ||
       ((((uVar5 - 0x1863 < 5 && (uVar5 - 0x1863 != 2)) ||
         ((uVar5 - 0x662 < 7 && ((0x61U >> (uVar5 - 0x662 & 0x1f) & 1) != 0)))) ||
        ((uVar5 - 0x15 < 2 || (uVar7 = '\0', uVar5 == 0x8d6)))))))))) {
    uVar6 = uVar6 & 0xff;
    uVar7 = '\x01';
  }
  uVar5 = MI->flat_insn->id;
  if (uVar5 - 0x9c < 2) {
    if (OpNo == 1) {
      uVar7 = '\x02';
    }
    if (OpNo == 1) {
      uVar6 = uVar6 & 0xffff;
    }
    uVar8 = uVar6;
    if ((long)uVar6 < 10) {
LAB_001a21ff:
      fmt = "%lu";
      uVar6 = uVar8;
      goto LAB_001a2219;
    }
LAB_001a21d8:
    fmt = "0x%lx";
    uVar8 = uVar6;
  }
  else {
    uVar8 = uVar6;
    if (uVar5 == 0x19) {
LAB_001a219d:
      if (9 < uVar6) {
        bVar4 = MI->op1_size;
        if (bVar4 == 0) {
          bVar4 = MI->imm_size;
        }
        uVar6 = uVar6 & arch_masks[bVar4];
        goto LAB_001a21d8;
      }
    }
    else {
      if (uVar5 != 0x95) {
        if ((uVar5 != 0x145) && (uVar5 != 0x147)) {
          if ((long)uVar6 < 0) {
            uVar8 = -uVar6;
            if (uVar6 < 0xfffffffffffffff7) {
              fmt = "-0x%lx";
            }
            else {
              fmt = "-%lu";
            }
            goto LAB_001a2219;
          }
          if (uVar6 < 10) goto LAB_001a21ff;
          goto LAB_001a21d8;
        }
        goto LAB_001a219d;
      }
      if (9 < uVar6) {
        uVar8 = uVar6 & 0xffff;
        fmt = "0x%x";
        uVar6 = uVar8;
        goto LAB_001a2219;
      }
    }
    fmt = "%u";
  }
LAB_001a2219:
  SStream_concat(O,fmt,uVar8);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    uVar8 = (ulong)(pcVar2->field_6).x86.op_count;
    if (MI->csh->doing_mem == true) {
      *(ulong *)(pcVar2->groups + uVar8 * 0x30 + 0x56) = uVar6;
    }
    else {
      puVar1 = pcVar2->groups + uVar8 * 0x30 + 0x3e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      if (uVar7 == '\0') {
        pcVar2 = MI->flat_insn->detail;
        uVar8 = (ulong)(pcVar2->field_6).x86.op_count;
        if (uVar8 == 0) {
          *(uint8_t *)((long)&pcVar2->field_6 + 0x50) = MI->imm_size;
        }
        else {
          if ((MI->flat_insn->id & 0xfffffffe) == 0x9c) {
            uVar7 = MI->imm_size;
          }
          else {
            uVar7 = *(uint8_t *)((long)&pcVar2->field_6 + 0x50);
          }
          pcVar2->groups[uVar8 * 0x30 + 0x5e] = uVar7;
        }
      }
      else {
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)(pcVar2->field_6).x86.op_count * 0x30 + 0x5e] = uVar7;
      }
      pcVar2 = MI->flat_insn->detail;
      *(ulong *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.op_count * 0x30 + 0x46) = uVar6;
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  return;
}

Assistant:

static void printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op;

	if (OpNo >= MI->size)
		return;

	Op = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isReg(Op)) {
		unsigned int reg = MCOperand_getReg(Op);
		printRegName(O, reg);
		reg = Mips_map_register(reg);
		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].mem.base = reg;
			} else {
				MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].type = MIPS_OP_REG;
				MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].reg = reg;
				MI->flat_insn->detail->mips.op_count++;
			}
		}
	} else if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op);
		if (MI->csh->doing_mem) {
			if (imm) {	// only print Imm offset if it is not 0
				if (imm >= 0) {
					if (imm > HEX_THRESHOLD)
						SStream_concat(O, "0x%"PRIx64, imm);
					else
						SStream_concat(O, "%"PRIu64, imm);
				} else {
					if (imm < -HEX_THRESHOLD)
						SStream_concat(O, "-0x%"PRIx64, -imm);
					else
						SStream_concat(O, "-%"PRIu64, -imm);
				}
			}
			if (MI->csh->detail)
				MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].mem.disp = imm;
		} else {
			if (imm >= 0) {
				if (imm > HEX_THRESHOLD)
					SStream_concat(O, "0x%"PRIx64, imm);
				else
					SStream_concat(O, "%"PRIu64, imm);
			} else {
				if (imm < -HEX_THRESHOLD)
					SStream_concat(O, "-0x%"PRIx64, -imm);
				else
					SStream_concat(O, "-%"PRIu64, -imm);
			}

			if (MI->csh->detail) {
				MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].type = MIPS_OP_IMM;
				MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].imm = imm;
				MI->flat_insn->detail->mips.op_count++;
			}
		}
	}
}